

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

TArray<FxExpression_*,_FxExpression_*> * __thiscall
TArray<FxExpression_*,_FxExpression_*>::operator=
          (TArray<FxExpression_*,_FxExpression_*> *this,
          TArray<FxExpression_*,_FxExpression_*> *other)

{
  if (this->Array != (FxExpression **)0x0) {
    M_Free(this->Array);
  }
  this->Array = other->Array;
  other->Array = (FxExpression **)0x0;
  this->Most = other->Most;
  other->Most = 0;
  this->Count = other->Count;
  other->Count = 0;
  return this;
}

Assistant:

TArray<T,TT> &operator= (TArray<T,TT> &&other)
	{
		if (Array)
		{
			if (Count > 0)
			{
				DoDelete (0, Count-1);
			}
			M_Free (Array);
		}
		Array = other.Array; other.Array = NULL;
		Most = other.Most; other.Most = 0;
		Count = other.Count; other.Count = 0;
		return *this;
	}